

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  cmCTest *pcVar1;
  cmState *this_00;
  char __rhs;
  bool bVar2;
  CURLcode CVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  CURL_conflict *data;
  long lVar8;
  cmCTestScriptHandler *pcVar9;
  char *pcVar10;
  unsigned_long uVar11;
  char *pcVar12;
  long lVar13;
  byte bVar14;
  undefined8 uVar15;
  string *arg;
  pointer pbVar16;
  pointer pbVar17;
  int iVar18;
  allocator<char> local_7f9;
  string retryDelay;
  cmCTestSubmitHandlerVectorOfChar chunk;
  byte local_7bc;
  allocator<char> local_7b2;
  allocator<char> local_7b1;
  string local_7b0;
  curl_slist *local_790;
  string local_file;
  FILE *local_768;
  string retryCount;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  string upload_as;
  string remote_file;
  string curlopt;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string ofile;
  _Vector_base<char,_std::allocator<char>_> local_4c8;
  _Vector_base<char,_std::allocator<char>_> local_4b0;
  string local_498;
  string local_478;
  string local_458;
  char error_buffer [1024];
  
  local_790 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar16 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar17 = (this->HttpHeaders).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar16;
      pbVar17 = pbVar17 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Add HTTP Header: \"");
    poVar7 = std::operator<<(poVar7,(string *)pbVar17);
    poVar7 = std::operator<<(poVar7,"\"");
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x96,curlopt._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&curlopt);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    local_790 = curl_slist_append(local_790,(pbVar17->_M_dataplus)._M_p);
  }
  curl_global_init(3);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CurlOptions",(allocator<char> *)&local_file);
  cmCTest::GetCTestConfiguration(&curlopt,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&curlopt,&args,false);
  pbVar17 = args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_7bc = 0;
  bVar14 = 0;
  for (pbVar16 = args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar17;
      pbVar16 = pbVar16 + 1) {
    bVar2 = std::operator==(pbVar16,"CURLOPT_SSL_VERIFYPEER_OFF");
    bVar14 = bVar14 | bVar2;
    bVar2 = std::operator==(pbVar16,"CURLOPT_SSL_VERIFYHOST_OFF");
    local_7bc = local_7bc | bVar2;
  }
  pbVar17 = (files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = (files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar17 == pbVar16) {
      curl_slist_free_all(local_790);
      curl_global_cleanup();
LAB_0018213c:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      std::__cxx11::string::~string((string *)&curlopt);
      return pbVar17 == pbVar16;
    }
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      cmCurlSetCAInfo_abi_cxx11_(&local_458,data,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_458);
      if (bVar14 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSL_VERIFYPEER to off\n");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb1,local_file._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&local_file);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
      }
      if (local_7bc != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSL_VERIFYHOST to off\n");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb7,local_file._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&local_file);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        curl_easy_setopt(data,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
        uVar15 = 4;
        if (this->HTTPProxyType != 2) {
          if (this->HTTPProxyType != 3) {
            curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
            if ((this->HTTPProxyAuth)._M_string_length != 0) {
              curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
            }
            goto LAB_00180e5c;
          }
          uVar15 = 5;
        }
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,uVar15);
      }
LAB_00180e5c:
      bVar2 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar2) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,0x78);
      curl_easy_setopt(data,CURLOPT_PUT,1);
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,local_790);
      std::__cxx11::string::string((string *)&local_file,(string *)pbVar17);
      bVar2 = cmsys::SystemTools::FileExists(&local_file);
      if (!bVar2) {
        std::operator+(&remote_file,localprefix,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg,&remote_file,pbVar17);
        std::__cxx11::string::operator=((string *)&local_file,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&remote_file);
      }
      cmsys::SystemTools::GetFilenameName((string *)&cmCTestLog_msg,pbVar17);
      std::operator+(&remote_file,remoteprefix,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar7 = std::operator<<(this->LogFile,"\tUpload file: ");
      poVar7 = std::operator<<(poVar7,(string *)&local_file);
      poVar7 = std::operator<<(poVar7," to ");
      poVar7 = std::operator<<(poVar7,(string *)&remote_file);
      std::endl<char,std::char_traits<char>>(poVar7);
      cmSystemTools::EncodeURL(&ofile,&remote_file,true);
      lVar8 = std::__cxx11::string::find((char)url,0x3f);
      __rhs = '&';
      if (lVar8 == -1) {
        __rhs = '?';
      }
      std::operator+(&retryDelay,url,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&retryDelay,"FileName=");
      std::operator+(&upload_as,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&ofile);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&retryDelay);
      if (!bVar2) {
        cmCTestCurl::cmCTestCurl
                  ((cmCTestCurl *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::append((char *)&upload_as);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b0,"BuildName",(allocator<char> *)&chunk);
        cmCTest::GetCTestConfiguration(&retryCount,pcVar1,&local_7b0);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::__cxx11::string::append((char *)&upload_as);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b0,"Site",(allocator<char> *)&chunk);
        cmCTest::GetCTestConfiguration(&retryCount,pcVar1,&local_7b0);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::__cxx11::string::append((char *)&upload_as);
        cmCTest::GetCurrentTag_abi_cxx11_(&retryCount,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::append((char *)&upload_as);
        cmCTest::GetTestModelString_abi_cxx11_
                  (&retryCount,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        pcVar9 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        if (pcVar9->CMake != (cmake *)0x0) {
          this_00 = (pcVar9->CMake->State)._M_t.
                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&retryDelay,"SubProject",(allocator<char> *)&retryCount);
          pcVar10 = cmState::GetGlobalProperty(this_00,&retryDelay);
          std::__cxx11::string::~string((string *)&retryDelay);
          if (pcVar10 != (char *)0x0) {
            std::__cxx11::string::append((char *)&upload_as);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&retryCount,pcVar10,(allocator<char> *)&local_7b0);
            cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
            std::__cxx11::string::append((string *)&upload_as);
            std::__cxx11::string::~string((string *)&retryDelay);
            std::__cxx11::string::~string((string *)&retryCount);
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)&cmCTestLog_msg);
      }
      std::__cxx11::string::append((char *)&upload_as);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,"InternalTest",(allocator<char> *)&retryDelay);
      pcVar10 = cmCTestGenericHandler::GetOption
                          (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
      bVar2 = cmSystemTools::IsOn(pcVar10);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (bVar2) {
        std::__cxx11::string::append((char *)&upload_as);
      }
      else {
        cmSystemTools::ComputeFileHash((string *)&cmCTestLog_msg,&local_file,AlgoMD5);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      }
      bVar2 = std::operator==(pbVar17,"Done.xml");
      if (bVar2) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      bVar2 = cmsys::SystemTools::FileExists(&local_file);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Cannot find file: ");
        poVar7 = std::operator<<(poVar7,(string *)&local_file);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x123,retryDelay._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_cleanup(data);
        curl_slist_free_all(local_790);
        curl_global_cleanup();
        std::__cxx11::string::~string((string *)&upload_as);
        std::__cxx11::string::~string((string *)&ofile);
        std::__cxx11::string::~string((string *)&remote_file);
        std::__cxx11::string::~string((string *)&local_file);
        goto LAB_0018213c;
      }
      uVar11 = cmsys::SystemTools::FileLength(&local_file);
      local_768 = (FILE *)cmsys::SystemTools::Fopen(&local_file,"rb");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Upload file: ");
      poVar7 = std::operator<<(poVar7,(string *)&local_file);
      poVar7 = std::operator<<(poVar7," to ");
      poVar7 = std::operator<<(poVar7,(string *)&upload_as);
      poVar7 = std::operator<<(poVar7," Size: ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x130,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&retryDelay);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      curl_easy_setopt(data,CURLOPT_URL,upload_as._M_dataplus._M_p);
      curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
      curl_easy_setopt(data,CURLOPT_READDATA,local_768);
      curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar11);
      curl_easy_setopt(data,CURLOPT_ERRORBUFFER,error_buffer);
      curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
      curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      curl_easy_setopt(data,CURLOPT_WRITEDATA,&chunk);
      curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
      CVar3 = curl_easy_perform(data);
      if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
        retryDelay._M_string_length =
             (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        retryDelay._M_dataplus._M_p =
             chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
        poVar7 = operator<<(poVar7,(cmCTestLogWrite *)&retryDelay);
        poVar7 = std::operator<<(poVar7,"]");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x156,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_4b0,&chunk);
        ParseResponse(this,(cmCTestSubmitHandlerVectorOfChar *)&local_4b0);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_4b0);
      }
      if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL debug output: [");
        retryDelay._M_string_length =
             (long)chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        retryDelay._M_dataplus._M_p =
             chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        poVar7 = operator<<(poVar7,(cmCTestLogWrite *)&retryDelay);
        poVar7 = std::operator<<(poVar7,"]");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x15f,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      if ((CVar3 != CURLE_OK) || (bVar2 = true, this->HasErrors == true)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"RetryDelay",(allocator<char> *)&retryCount);
        pcVar10 = cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
        pcVar12 = "";
        if (pcVar10 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_478,"RetryDelay",&local_7b1);
          pcVar12 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_478);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&retryDelay,pcVar12,(allocator<char> *)&local_7b0);
        if (pcVar10 != (char *)0x0) {
          std::__cxx11::string::~string((string *)&local_478);
        }
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"RetryCount",(allocator<char> *)&local_7b0);
        pcVar10 = cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
        pcVar12 = "";
        if (pcVar10 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,"RetryCount",&local_7b2);
          pcVar12 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_498);
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&retryCount,pcVar12,&local_7f9)
        ;
        if (pcVar10 != (char *)0x0) {
          std::__cxx11::string::~string((string *)&local_498);
        }
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (retryDelay._M_string_length == 0) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7b0,"CTestSubmitRetryDelay",&local_7f9);
          cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar1,&local_7b0);
          iVar4 = atoi(_cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_7b0);
        }
        else {
          iVar4 = atoi(retryDelay._M_dataplus._M_p);
        }
        if (retryCount._M_string_length == 0) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7b0,"CTestSubmitRetryCount",&local_7f9);
          cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar1,&local_7b0);
          iVar5 = atoi(_cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_7b0);
        }
        else {
          iVar5 = atoi(retryCount._M_dataplus._M_p);
        }
        iVar18 = 0;
        iVar6 = 0;
        if (0 < iVar5) {
          iVar6 = iVar5;
        }
        do {
          if (iVar18 == iVar6) goto LAB_00181caa;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,"   Submit failed, waiting ");
          poVar7 = std::ostream::_M_insert<double>((double)iVar4);
          std::operator<<(poVar7," seconds...\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x17a,local_7b0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_7b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          lVar8 = std::chrono::_V2::steady_clock::now();
          while (lVar13 = std::chrono::_V2::steady_clock::now(),
                (double)lVar13 < (double)lVar8 + (double)iVar4 * 1000000000.0) {
            cmsys::SystemTools::Delay(100);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Retry submission: Attempt ");
          iVar18 = iVar18 + 1;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar18);
          poVar7 = std::operator<<(poVar7," of ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x184,local_7b0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_7b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          fclose(local_768);
          local_768 = (FILE *)cmsys::SystemTools::Fopen(&local_file,"rb");
          curl_easy_setopt(data,CURLOPT_READDATA,local_768);
          if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          this->HasErrors = false;
          CVar3 = curl_easy_perform(data);
          if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
            local_7b0._M_string_length =
                 (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_7b0._M_dataplus._M_p =
                 chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            poVar7 = operator<<(poVar7,(cmCTestLogWrite *)&local_7b0);
            poVar7 = std::operator<<(poVar7,"]");
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x195,local_7b0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            std::__cxx11::string::~string((string *)&local_7b0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_4c8,&chunk);
            ParseResponse(this,(cmCTestSubmitHandlerVectorOfChar *)&local_4c8);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_4c8);
          }
        } while ((CVar3 != CURLE_OK) || (this->HasErrors != false));
        CVar3 = CURLE_OK;
LAB_00181caa:
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&retryDelay);
        bVar2 = CVar3 == CURLE_OK;
      }
      fclose(local_768);
      if (bVar2) {
        curl_easy_cleanup(data);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+(&retryDelay,"   Uploaded: ",&local_file);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&retryDelay);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&retryDelay);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1bd,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Error when uploading file: ");
        poVar7 = std::operator<<(poVar7,(string *)&local_file);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a3,retryDelay._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Error message was: ");
        poVar7 = std::operator<<(poVar7,error_buffer);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a5,retryDelay._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<(this->LogFile,"   Error when uploading file: ");
        poVar7 = std::operator<<(poVar7,(string *)&local_file);
        poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::operator<<(poVar7,"   Error message was: ");
        poVar7 = std::operator<<(poVar7,error_buffer);
        std::endl<char,std::char_traits<char>>(poVar7);
        if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          poVar7 = std::operator<<(this->LogFile,"   Curl output was: ");
          _cmCTestLog_msg =
               chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start;
          poVar7 = operator<<(poVar7,(cmCTestLogWrite *)&cmCTestLog_msg);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
          retryDelay._M_string_length =
               (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          retryDelay._M_dataplus._M_p =
               chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start;
          poVar7 = operator<<(poVar7,(cmCTestLogWrite *)&retryDelay);
          poVar7 = std::operator<<(poVar7,"]");
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1b2,retryDelay._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&retryDelay);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
        curl_easy_cleanup(data);
        curl_slist_free_all(local_790);
        curl_global_cleanup();
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&chunk.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&upload_as);
      std::__cxx11::string::~string((string *)&ofile);
      std::__cxx11::string::~string((string *)&remote_file);
      std::__cxx11::string::~string((string *)&local_file);
      if (!bVar2) goto LAB_0018213c;
    }
    pbVar17 = pbVar17 + 1;
  } while( true );
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args;
  cmSystemTools::ExpandListArgument(curlopt, args);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                         SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT);

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = localprefix + "/" + file;
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as = url +
        ((url.find('?') == std::string::npos) ? '?' : '&') +
        "FileName=" + ofile;

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          const char* subproject =
            cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(subproject);
          }
        }
      }

      upload_as += "&MD5=";

      if (cmSystemTools::IsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = this->GetOption("RetryDelay") == nullptr
          ? ""
          : this->GetOption("RetryDelay");
        std::string retryCount = this->GetOption("RetryCount") == nullptr
          ? ""
          : this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}